

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

vector<cmTarget_*,_std::allocator<cmTarget_*>_> * __thiscall
cmMakefile::GetImportedTargets
          (vector<cmTarget_*,_std::allocator<cmTarget_*>_> *__return_storage_ptr__,cmMakefile *this)

{
  pointer *pppcVar1;
  iterator __position;
  _Hash_node_base *p_Var2;
  
  (__return_storage_ptr__->super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::reserve
            (__return_storage_ptr__,(this->ImportedTargets)._M_h._M_element_count);
  for (p_Var2 = (this->ImportedTargets)._M_h._M_before_begin._M_nxt;
      p_Var2 != (_Hash_node_base *)0x0; p_Var2 = p_Var2->_M_nxt) {
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<cmTarget*,std::allocator<cmTarget*>>::_M_realloc_insert<cmTarget*const&>
                ((vector<cmTarget*,std::allocator<cmTarget*>> *)__return_storage_ptr__,__position,
                 (cmTarget **)(p_Var2 + 5));
    }
    else {
      *__position._M_current = (cmTarget *)p_Var2[5]._M_nxt;
      pppcVar1 = &(__return_storage_ptr__->
                  super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppcVar1 = *pppcVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmTarget*> cmMakefile::GetImportedTargets() const
{
  std::vector<cmTarget*> tgts;
  tgts.reserve(this->ImportedTargets.size());
  for (auto const& impTarget : this->ImportedTargets) {
    tgts.push_back(impTarget.second);
  }
  return tgts;
}